

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMeshEffect.cpp
# Opt level: O3

void * __thiscall dgMeshEffect::GetNextFace(dgMeshEffect *this,void *face)

{
  int iVar1;
  dgEdge *ptr;
  dgRedBackNode *pdVar2;
  Iterator local_20;
  
  iVar1 = *(int *)((long)face + 0x50);
  local_20.m_ptr = (dgRedBackNode *)face;
  local_20.m_tree = (dgTree<dgEdge,_long> *)this;
  dgTree<dgEdge,_long>::Iterator::operator++(&local_20,0);
  if (local_20.m_ptr != (dgRedBackNode *)0x0) {
    do {
      if (*(int *)&local_20.m_ptr[2]._vptr_dgRedBackNode != iVar1) {
        pdVar2 = local_20.m_ptr + 1;
        do {
          *(int *)&pdVar2[1]._vptr_dgRedBackNode = iVar1;
          pdVar2 = pdVar2->m_right;
        } while (pdVar2 != local_20.m_ptr + 1);
        return local_20.m_ptr;
      }
      dgTree<dgEdge,_long>::Iterator::operator++(&local_20,0);
    } while (local_20.m_ptr != (dgRedBackNode *)0x0);
  }
  return (void *)0x0;
}

Assistant:

void* dgMeshEffect::GetNextFace (const void* const face)
{
	dgTreeNode* node = (dgTreeNode*) face;
	hacd::HaI32 mark = node->GetInfo().m_mark;

	Iterator iter (*this);
	iter.Set (node);
	for (iter ++; iter; iter ++) {
		dgTreeNode* node = iter.GetNode();
		if (node->GetInfo().m_mark != mark) {
			dgEdge* const edge = &node->GetInfo();
			dgEdge* ptr = edge;
			do {
				ptr->m_mark = mark;
				ptr = ptr->m_next;
			} while (ptr != edge);
			return node; 
		}
	}
	return NULL; 
}